

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void VP8LEncDspInit(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&VP8LEncDspInit::VP8LEncDspInit_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (VP8LEncDspInit::VP8LEncDspInit_body_last_cpuinfo_used != VP8GetCPUInfo) {
    VP8LDspInit();
    VP8LSubtractGreenFromBlueAndRed = VP8LSubtractGreenFromBlueAndRed_C;
    VP8LTransformColor = VP8LTransformColor_C;
    VP8LCollectColorBlueTransforms = VP8LCollectColorBlueTransforms_C;
    VP8LCollectColorRedTransforms = VP8LCollectColorRedTransforms_C;
    VP8LFastLog2Slow = FastLog2Slow_C;
    VP8LFastSLog2Slow = FastSLog2Slow_C;
    VP8LExtraCost = ExtraCost_C;
    VP8LCombinedShannonEntropy = CombinedShannonEntropy_C;
    VP8LShannonEntropy = ShannonEntropy_C;
    VP8LGetEntropyUnrefined = GetEntropyUnrefined_C;
    VP8LGetCombinedEntropyUnrefined = GetCombinedEntropyUnrefined_C;
    VP8LAddVector = AddVector_C;
    VP8LAddVectorEq = AddVectorEq_C;
    VP8LVectorMismatch = VectorMismatch_C;
    VP8LBundleColorMap = VP8LBundleColorMap_C;
    VP8LPredictorsSub[0] = PredictorSub0_C;
    VP8LPredictorsSub[1] = PredictorSub1_C;
    VP8LPredictorsSub[2] = PredictorSub2_C;
    VP8LPredictorsSub[3] = PredictorSub3_C;
    VP8LPredictorsSub[4] = PredictorSub4_C;
    VP8LPredictorsSub[5] = PredictorSub5_C;
    VP8LPredictorsSub[6] = PredictorSub6_C;
    VP8LPredictorsSub[7] = PredictorSub7_C;
    VP8LPredictorsSub[8] = PredictorSub8_C;
    VP8LPredictorsSub[9] = PredictorSub9_C;
    VP8LPredictorsSub[10] = PredictorSub10_C;
    VP8LPredictorsSub[0xb] = PredictorSub11_C;
    VP8LPredictorsSub[0xc] = PredictorSub12_C;
    VP8LPredictorsSub[0xd] = PredictorSub13_C;
    VP8LPredictorsSub[0xe] = PredictorSub0_C;
    VP8LPredictorsSub[0xf] = PredictorSub0_C;
    VP8LPredictorsSub_C[0] = PredictorSub0_C;
    VP8LPredictorsSub_C[1] = PredictorSub1_C;
    VP8LPredictorsSub_C[2] = PredictorSub2_C;
    VP8LPredictorsSub_C[3] = PredictorSub3_C;
    VP8LPredictorsSub_C[4] = PredictorSub4_C;
    VP8LPredictorsSub_C[5] = PredictorSub5_C;
    VP8LPredictorsSub_C[6] = PredictorSub6_C;
    VP8LPredictorsSub_C[7] = PredictorSub7_C;
    VP8LPredictorsSub_C[8] = PredictorSub8_C;
    VP8LPredictorsSub_C[9] = PredictorSub9_C;
    VP8LPredictorsSub_C[10] = PredictorSub10_C;
    VP8LPredictorsSub_C[0xb] = PredictorSub11_C;
    VP8LPredictorsSub_C[0xc] = PredictorSub12_C;
    VP8LPredictorsSub_C[0xd] = PredictorSub13_C;
    VP8LPredictorsSub_C[0xe] = PredictorSub0_C;
    VP8LPredictorsSub_C[0xf] = PredictorSub0_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        VP8LEncDspInitSSE2();
        iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
        if (iVar1 != 0) {
          VP8LEncDspInitSSE41();
          iVar1 = (*VP8GetCPUInfo)(kAVX2);
          if (iVar1 != 0) {
            VP8LEncDspInitAVX2();
          }
        }
      }
    }
  }
  VP8LEncDspInit::VP8LEncDspInit_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&VP8LEncDspInit::VP8LEncDspInit_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(VP8LEncDspInit) {
  VP8LDspInit();

#if !WEBP_NEON_OMIT_C_CODE
  VP8LSubtractGreenFromBlueAndRed = VP8LSubtractGreenFromBlueAndRed_C;

  VP8LTransformColor = VP8LTransformColor_C;
#endif

  VP8LCollectColorBlueTransforms = VP8LCollectColorBlueTransforms_C;
  VP8LCollectColorRedTransforms = VP8LCollectColorRedTransforms_C;

  VP8LFastLog2Slow = FastLog2Slow_C;
  VP8LFastSLog2Slow = FastSLog2Slow_C;

  VP8LExtraCost = ExtraCost_C;
  VP8LCombinedShannonEntropy = CombinedShannonEntropy_C;
  VP8LShannonEntropy = ShannonEntropy_C;

  VP8LGetEntropyUnrefined = GetEntropyUnrefined_C;
  VP8LGetCombinedEntropyUnrefined = GetCombinedEntropyUnrefined_C;

  VP8LAddVector = AddVector_C;
  VP8LAddVectorEq = AddVectorEq_C;

  VP8LVectorMismatch = VectorMismatch_C;
  VP8LBundleColorMap = VP8LBundleColorMap_C;

  VP8LPredictorsSub[0] = PredictorSub0_C;
  VP8LPredictorsSub[1] = PredictorSub1_C;
  VP8LPredictorsSub[2] = PredictorSub2_C;
  VP8LPredictorsSub[3] = PredictorSub3_C;
  VP8LPredictorsSub[4] = PredictorSub4_C;
  VP8LPredictorsSub[5] = PredictorSub5_C;
  VP8LPredictorsSub[6] = PredictorSub6_C;
  VP8LPredictorsSub[7] = PredictorSub7_C;
  VP8LPredictorsSub[8] = PredictorSub8_C;
  VP8LPredictorsSub[9] = PredictorSub9_C;
  VP8LPredictorsSub[10] = PredictorSub10_C;
  VP8LPredictorsSub[11] = PredictorSub11_C;
  VP8LPredictorsSub[12] = PredictorSub12_C;
  VP8LPredictorsSub[13] = PredictorSub13_C;
  VP8LPredictorsSub[14] = PredictorSub0_C;  // <- padding security sentinels
  VP8LPredictorsSub[15] = PredictorSub0_C;

  VP8LPredictorsSub_C[0] = PredictorSub0_C;
  VP8LPredictorsSub_C[1] = PredictorSub1_C;
  VP8LPredictorsSub_C[2] = PredictorSub2_C;
  VP8LPredictorsSub_C[3] = PredictorSub3_C;
  VP8LPredictorsSub_C[4] = PredictorSub4_C;
  VP8LPredictorsSub_C[5] = PredictorSub5_C;
  VP8LPredictorsSub_C[6] = PredictorSub6_C;
  VP8LPredictorsSub_C[7] = PredictorSub7_C;
  VP8LPredictorsSub_C[8] = PredictorSub8_C;
  VP8LPredictorsSub_C[9] = PredictorSub9_C;
  VP8LPredictorsSub_C[10] = PredictorSub10_C;
  VP8LPredictorsSub_C[11] = PredictorSub11_C;
  VP8LPredictorsSub_C[12] = PredictorSub12_C;
  VP8LPredictorsSub_C[13] = PredictorSub13_C;
  VP8LPredictorsSub_C[14] = PredictorSub0_C;  // <- padding security sentinels
  VP8LPredictorsSub_C[15] = PredictorSub0_C;

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      VP8LEncDspInitSSE2();
#if defined(WEBP_HAVE_SSE41)
      if (VP8GetCPUInfo(kSSE4_1)) {
        VP8LEncDspInitSSE41();
#if defined(WEBP_HAVE_AVX2)
        if (VP8GetCPUInfo(kAVX2)) {
          VP8LEncDspInitAVX2();
        }
#endif
      }
#endif
    }
#endif
#if defined(WEBP_USE_MIPS32)
    if (VP8GetCPUInfo(kMIPS32)) {
      VP8LEncDspInitMIPS32();
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      VP8LEncDspInitMIPSdspR2();
    }
#endif
#if defined(WEBP_USE_MSA)
    if (VP8GetCPUInfo(kMSA)) {
      VP8LEncDspInitMSA();
    }
#endif
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (VP8GetCPUInfo != NULL && VP8GetCPUInfo(kNEON))) {
    VP8LEncDspInitNEON();
  }
#endif

  assert(VP8LSubtractGreenFromBlueAndRed != NULL);
  assert(VP8LTransformColor != NULL);
  assert(VP8LCollectColorBlueTransforms != NULL);
  assert(VP8LCollectColorRedTransforms != NULL);
  assert(VP8LFastLog2Slow != NULL);
  assert(VP8LFastSLog2Slow != NULL);
  assert(VP8LExtraCost != NULL);
  assert(VP8LCombinedShannonEntropy != NULL);
  assert(VP8LShannonEntropy != NULL);
  assert(VP8LGetEntropyUnrefined != NULL);
  assert(VP8LGetCombinedEntropyUnrefined != NULL);
  assert(VP8LAddVector != NULL);
  assert(VP8LAddVectorEq != NULL);
  assert(VP8LVectorMismatch != NULL);
  assert(VP8LBundleColorMap != NULL);
  assert(VP8LPredictorsSub[0] != NULL);
  assert(VP8LPredictorsSub[1] != NULL);
  assert(VP8LPredictorsSub[2] != NULL);
  assert(VP8LPredictorsSub[3] != NULL);
  assert(VP8LPredictorsSub[4] != NULL);
  assert(VP8LPredictorsSub[5] != NULL);
  assert(VP8LPredictorsSub[6] != NULL);
  assert(VP8LPredictorsSub[7] != NULL);
  assert(VP8LPredictorsSub[8] != NULL);
  assert(VP8LPredictorsSub[9] != NULL);
  assert(VP8LPredictorsSub[10] != NULL);
  assert(VP8LPredictorsSub[11] != NULL);
  assert(VP8LPredictorsSub[12] != NULL);
  assert(VP8LPredictorsSub[13] != NULL);
  assert(VP8LPredictorsSub[14] != NULL);
  assert(VP8LPredictorsSub[15] != NULL);
  assert(VP8LPredictorsSub_C[0] != NULL);
  assert(VP8LPredictorsSub_C[1] != NULL);
  assert(VP8LPredictorsSub_C[2] != NULL);
  assert(VP8LPredictorsSub_C[3] != NULL);
  assert(VP8LPredictorsSub_C[4] != NULL);
  assert(VP8LPredictorsSub_C[5] != NULL);
  assert(VP8LPredictorsSub_C[6] != NULL);
  assert(VP8LPredictorsSub_C[7] != NULL);
  assert(VP8LPredictorsSub_C[8] != NULL);
  assert(VP8LPredictorsSub_C[9] != NULL);
  assert(VP8LPredictorsSub_C[10] != NULL);
  assert(VP8LPredictorsSub_C[11] != NULL);
  assert(VP8LPredictorsSub_C[12] != NULL);
  assert(VP8LPredictorsSub_C[13] != NULL);
  assert(VP8LPredictorsSub_C[14] != NULL);
  assert(VP8LPredictorsSub_C[15] != NULL);
}